

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_setlocal(lua_State *L)

{
  TValue *pTVar1;
  TValue *pTVar2;
  int32_t iVar3;
  int iVar4;
  char *str;
  uint uVar5;
  lua_State *L_00;
  lua_Debug ar;
  lua_Debug lStack_98;
  
  pTVar1 = L->base;
  uVar5 = 0;
  L_00 = L;
  if ((pTVar1 < L->top) && ((pTVar1->field_2).it == 0xfffffff9)) {
    uVar5 = 1;
    L_00 = (lua_State *)(ulong)(pTVar1->u32).lo;
  }
  iVar3 = lj_lib_checkint(L,uVar5 + 1);
  iVar4 = lua_getstack(L_00,iVar3,&lStack_98);
  if (iVar4 == 0) {
    lj_err_arg(L,uVar5 + 1,LJ_ERR_LVLRNG);
  }
  pTVar1 = L->base;
  if (L->top <= pTVar1 + ((ulong)(uVar5 + 3) - 1)) {
    lj_err_arg(L,uVar5 + 3,LJ_ERR_NOVAL);
  }
  pTVar2 = L_00->top;
  L_00->top = pTVar2 + 1;
  *pTVar2 = pTVar1[(ulong)(uVar5 + 3) - 1];
  iVar3 = lj_lib_checkint(L,uVar5 | 2);
  str = lua_setlocal(L_00,&lStack_98,iVar3);
  lua_pushstring(L,str);
  return 1;
}

Assistant:

LJLIB_CF(debug_setlocal)
{
  int arg;
  lua_State *L1 = getthread(L, &arg);
  lua_Debug ar;
  TValue *tv;
  if (!lua_getstack(L1, lj_lib_checkint(L, arg+1), &ar))
    lj_err_arg(L, arg+1, LJ_ERR_LVLRNG);
  tv = lj_lib_checkany(L, arg+3);
  copyTV(L1, L1->top++, tv);
  lua_pushstring(L, lua_setlocal(L1, &ar, lj_lib_checkint(L, arg+2)));
  return 1;
}